

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O2

void __thiscall catalog::showTable(catalog *this)

{
  ostream *poVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < this->tableNumber; lVar2 = lVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             (string *)
                             (this->TableInfoList).
                             super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar2]);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void catalog::showTable(){
    for(int i = 0 ; i < tableNumber ; i ++){
        std::cout<<TableInfoList[i]->tableName<<std::endl;
    }
}